

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib542.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  int local_24;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      local_24 = curl_easy_setopt(lVar2,0x29,1);
      if ((((local_24 == 0) && (local_24 = curl_easy_setopt(lVar2,0x2c,1), local_24 == 0)) &&
          (local_24 = curl_easy_setopt(lVar2,0x2a,0), local_24 == 0)) &&
         (local_24 = curl_easy_setopt(lVar2,0x2712,URL), local_24 == 0)) {
        local_24 = curl_easy_perform(lVar2);
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      URL_local._4_4_ = local_24;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  /* get a curl handle */
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* enable verbose */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* enable NOBODY */
  test_setopt(curl, CURLOPT_NOBODY, 1L);

  /* disable HEADER */
  test_setopt(curl, CURLOPT_HEADER, 0L);

  /* specify target */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Now run off and do what you've been told! */
  res = curl_easy_perform(curl);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}